

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respond.c
# Opt level: O0

int resp0_pipe_init(void *arg,nni_pipe *npipe,void *s)

{
  uint32_t uVar1;
  resp0_pipe *p;
  void *s_local;
  nni_pipe *npipe_local;
  void *arg_local;
  
  nni_aio_init((nni_aio *)((long)arg + 0x1f8),resp0_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x30),resp0_pipe_send_cb,arg);
  nni_list_init_offset((nni_list *)((long)arg + 0x18),0x28);
  *(nni_pipe **)arg = npipe;
  *(void **)((long)arg + 8) = s;
  *(undefined1 *)((long)arg + 0x10) = 0;
  uVar1 = nni_pipe_id(npipe);
  *(uint32_t *)((long)arg + 0x14) = uVar1;
  return 0;
}

Assistant:

static int
resp0_pipe_init(void *arg, nni_pipe *npipe, void *s)
{
	resp0_pipe *p = arg;

	nni_aio_init(&p->aio_recv, resp0_pipe_recv_cb, p);
	nni_aio_init(&p->aio_send, resp0_pipe_send_cb, p);

	NNI_LIST_INIT(&p->sendq, resp0_ctx, sqnode);

	p->npipe = npipe;
	p->psock = s;
	p->busy  = false;
	p->id    = nni_pipe_id(npipe);

	return (0);
}